

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *iEnd;
  BYTE *pBVar4;
  undefined8 *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  BYTE *pBVar9;
  ZSTD_matchState_t *pZVar10;
  BYTE *pBVar11;
  ulong *mEnd;
  U32 *pUVar12;
  U32 *pUVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  bool bVar16;
  uint uVar17;
  undefined8 uVar18;
  char cVar19;
  char cVar20;
  ulong *puVar21;
  ulong *puVar22;
  size_t sVar23;
  int *piVar24;
  seqDef *psVar25;
  byte bVar26;
  byte bVar28;
  byte bVar29;
  U32 UVar30;
  uint uVar31;
  int iVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  ulong *puVar36;
  uint uVar37;
  ulong *puVar38;
  long lVar39;
  uint uVar40;
  size_t _size;
  uint uVar41;
  BYTE *litEnd;
  ulong *puVar42;
  BYTE *pBVar43;
  int *piVar44;
  ulong *puVar45;
  ulong uVar46;
  ulong *puVar47;
  ulong *puVar48;
  ulong uVar49;
  int iVar50;
  int *iStart;
  ulong uVar51;
  char *_ptr;
  uint uVar52;
  BYTE *pBVar53;
  BYTE *litEnd_3;
  U32 UVar54;
  BYTE *litEnd_1;
  uint uVar55;
  ulong uVar57;
  int *piVar58;
  BYTE *pBVar59;
  uint uVar60;
  BYTE *base;
  BYTE *istart;
  BYTE *iend;
  BYTE *litLimit_w_1;
  U32 prefixLowestIndex;
  BYTE *prefixLowest;
  BYTE *ilimit;
  BYTE *dictEnd;
  BYTE *dictBase;
  U32 dictIndexDelta;
  BYTE *dictStart;
  U32 *hashLong;
  BYTE *litLimit_w;
  U32 dictStartIndex;
  U32 *hashSmall;
  uint local_144;
  BYTE *local_130;
  uint local_11c;
  byte bVar27;
  ulong uVar56;
  
  pBVar9 = (ms->window).base;
  iEnd = (ulong *)((long)src + srcSize);
  iVar50 = (int)pBVar9;
  uVar40 = (int)iEnd - iVar50;
  pBVar59 = (BYTE *)(ulong)uVar40;
  uVar41 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar37 = (ms->window).dictLimit;
  uVar17 = uVar40 - uVar41;
  if (uVar40 - uVar37 <= uVar41) {
    uVar17 = uVar37;
  }
  if (ms->loadedDictEnd != 0) {
    uVar17 = uVar37;
  }
  pZVar10 = ms->dictMatchState;
  uVar6 = (pZVar10->window).dictLimit;
  pBVar11 = (pZVar10->window).base;
  piVar44 = (int *)(pBVar11 + uVar6);
  iStart = (int *)(pBVar9 + uVar17);
  uVar41 = uVar41 + uVar37;
  puVar21 = (ulong *)((long)src + (srcSize - 8));
  mEnd = (ulong *)(pZVar10->window).nextSrc;
  uVar55 = ((int)pBVar11 - (int)mEnd) + uVar17;
  uVar56 = (ulong)uVar55;
  pUVar12 = pZVar10->hashTable;
  pUVar13 = pZVar10->chainTable;
  uVar31 = (pZVar10->cParams).hashLog;
  uVar60 = (pZVar10->cParams).chainLog;
  uVar52 = ((int)src - ((int)piVar44 + (int)iStart)) + (int)mEnd;
  uVar34 = (ms->cParams).minMatch;
  pUVar14 = ms->hashTable;
  uVar7 = (ms->cParams).hashLog;
  pUVar15 = ms->chainTable;
  uVar8 = (ms->cParams).chainLog;
  local_144 = *rep;
  local_11c = rep[1];
  uVar37 = uVar31 + 8;
  uVar33 = uVar60 + 8;
  pBVar53 = (BYTE *)(ulong)uVar33;
  bVar26 = (byte)uVar31;
  bVar27 = (byte)uVar60;
  cVar19 = (char)uVar7;
  cVar20 = (char)uVar8;
  if (uVar34 == 5) {
    if (uVar41 < uVar40) goto LAB_00175b63;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar60 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    if (uVar52 < local_144) goto LAB_00175b82;
    puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
    if (uVar52 < local_11c) goto LAB_00175ba1;
    if (puVar21 <= puVar42) goto LAB_001759df;
    if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar37)) || (0x20 < uVar33))
    goto LAB_00175b44;
    bVar28 = 0x40 - cVar19;
    bVar29 = 0x40 - cVar20;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar3 = (ulong *)((long)iEnd + -1);
    puVar22 = iEnd + -4;
    uVar37 = 0xbb000000;
LAB_00173bfa:
    uVar35 = *puVar42;
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar51 = uVar35 * -0x30e4432345000000 >> (bVar29 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    uVar57 = uVar35 * -0x30e4432345000000 >> (0x38 - bVar27 & 0x3f);
    uVar40 = pUVar12[uVar46 >> 8];
    uVar41 = pUVar13[uVar57 >> 8];
    UVar54 = (int)puVar42 - iVar50;
    uVar33 = pUVar14[uVar49];
    UVar30 = UVar54 + 1;
    uVar31 = UVar30 - local_144;
    piVar58 = (int *)(pBVar9 + uVar31);
    if (uVar31 < uVar17) {
      piVar58 = (int *)(pBVar11 + (uVar31 - uVar55));
    }
    uVar60 = pUVar15[uVar51];
    pUVar15[uVar51] = UVar54;
    pUVar14[uVar49] = UVar54;
    if ((2 < (uVar17 - 1) - uVar31) && (*piVar58 == *(int *)((long)puVar42 + 1))) {
      puVar38 = iEnd;
      if (uVar31 < uVar17) {
        puVar38 = mEnd;
      }
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar38,(BYTE *)iStart);
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          puVar42 = (ulong *)((long)puVar42 + 1);
          uVar35 = (long)puVar42 - (long)src;
          puVar38 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar42 <= iEnd) {
              if (puVar22 < puVar42) {
                ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
              }
              else {
                uVar46 = *(ulong *)((long)src + 8);
                *puVar38 = *src;
                puVar38[1] = uVar46;
                if (0x10 < uVar35) {
                  pBVar59 = seqStore->lit;
                  if (0xffffffffffffffe0 <
                      (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                  goto LAB_00175b06;
                  uVar46 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar59 + 0x18) = uVar46;
                  if (0x20 < (long)uVar35) {
                    lVar39 = 0;
                    do {
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                      uVar18 = puVar5[1];
                      pBVar53 = pBVar59 + lVar39 + 0x20;
                      *(undefined8 *)pBVar53 = *puVar5;
                      *(undefined8 *)(pBVar53 + 8) = uVar18;
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                      uVar18 = puVar5[1];
                      *(undefined8 *)(pBVar53 + 0x10) = *puVar5;
                      *(undefined8 *)(pBVar53 + 0x18) = uVar18;
                      lVar39 = lVar39 + 0x20;
                    } while (pBVar53 + 0x20 < pBVar59 + uVar35);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar35;
              if (0xffff < uVar35) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar53 = (BYTE *)(sVar23 + 4);
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar35;
              psVar25->offBase = 1;
              if (pBVar53 < (BYTE *)0x3) goto LAB_00175a2d;
              pBVar59 = (BYTE *)(sVar23 + 1);
              if (pBVar59 < (BYTE *)0x10000) goto LAB_00174774;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0017474e;
              goto LAB_00175aa9;
            }
            goto LAB_00175a8a;
          }
          goto LAB_00175a6b;
        }
        goto LAB_00175a4c;
      }
      goto LAB_00175a0e;
    }
    puVar38 = puVar42;
    if (uVar33 <= uVar17) {
      if ((char)uVar46 != (char)uVar40) goto LAB_00173f42;
      uVar40 = uVar40 >> 8;
      puVar38 = (ulong *)(pBVar11 + uVar40);
      if (puVar38 < mEnd) {
        iVar32 = 0;
        if ((uVar6 < uVar40) && (*puVar38 == uVar35)) {
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          pBVar53 = (BYTE *)(sVar23 + 8);
          uVar37 = UVar54 - (uVar40 + uVar55);
          iVar32 = 0xd;
          if (src < puVar42) {
            piVar58 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
            do {
              puVar38 = (ulong *)((long)puVar42 + -1);
              if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
                 (pBVar53 = pBVar53 + 1, puVar42 = puVar38, puVar38 <= src)) break;
              bVar16 = piVar44 < piVar58;
              piVar58 = (int *)((long)piVar58 + -1);
            } while (bVar16);
          }
        }
        if (iVar32 == 0xd) goto LAB_001745fc;
        puVar38 = puVar42;
        if (iVar32 == 0) goto LAB_00173f42;
        goto LAB_001749d9;
      }
      goto LAB_00175b25;
    }
    puVar36 = (ulong *)(pBVar9 + uVar33);
    if (*puVar36 == uVar35) {
      puVar38 = puVar42 + 1;
      puVar47 = puVar36 + 1;
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar47;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar47 == *puVar38) {
          puVar45 = puVar42 + 2;
          puVar47 = puVar36 + 2;
          do {
            if (puVar1 <= puVar45) goto LAB_0017419a;
            uVar35 = *puVar47;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_0017419a:
        if ((puVar45 < puVar2) && ((int)*puVar47 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar47 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar42 - (int)puVar36;
      if (src < puVar42) {
        piVar58 = (int *)(pBVar9 + ((ulong)uVar33 - 1));
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          if ((BYTE)*puVar38 != (BYTE)*piVar58) {
            puVar42 = (ulong *)((long)puVar38 + 1);
            goto LAB_001745fc;
          }
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) &&
                (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1), puVar38 = puVar42
                , bVar16));
        goto LAB_00174238;
      }
      goto LAB_001745fc;
    }
LAB_00173f42:
    if (uVar60 <= uVar17) {
      if ((char)uVar57 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        if ((uVar6 < uVar41) && (*(int *)(pBVar11 + uVar41) == (int)*puVar38)) {
          uVar60 = uVar41 + uVar55;
          piVar58 = (int *)(pBVar11 + uVar41);
          goto LAB_00173f5d;
        }
      }
LAB_001740a0:
      puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
      goto LAB_001749d9;
    }
    piVar58 = (int *)(pBVar9 + uVar60);
    if (*piVar58 != (int)*puVar38) goto LAB_001740a0;
LAB_00173f5d:
    uVar35 = *(ulong *)((long)puVar38 + 1);
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    puVar36 = (ulong *)((long)puVar38 + 1);
    uVar40 = pUVar14[uVar49];
    uVar41 = pUVar12[uVar46 >> 8];
    pUVar14[uVar49] = UVar30;
    puVar42 = puVar38;
    if (uVar17 < uVar40) {
      puVar45 = (ulong *)(pBVar9 + uVar40);
      if (*puVar45 != uVar35) goto LAB_0017424a;
      puVar42 = (ulong *)((long)puVar38 + 9);
      puVar48 = puVar45 + 1;
      puVar47 = puVar42;
      if (puVar42 < puVar1) {
        uVar46 = *puVar42 ^ *puVar48;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar48 == *puVar42) {
          puVar47 = (ulong *)((long)puVar38 + 0x11);
          puVar48 = puVar45 + 2;
          do {
            if (puVar1 <= puVar47) goto LAB_00174483;
            uVar35 = *puVar48;
            uVar46 = *puVar47;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar47 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar42));
            puVar47 = puVar47 + 1;
            puVar48 = puVar48 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_00174483:
        if ((puVar47 < puVar2) && ((int)*puVar48 == (int)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 4);
          puVar48 = (ulong *)((long)puVar48 + 4);
        }
        if ((puVar47 < puVar3) && ((short)*puVar48 == (short)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 2);
          puVar48 = (ulong *)((long)puVar48 + 2);
        }
        if (puVar47 < iEnd) {
          puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar47));
        }
        pBVar53 = (BYTE *)((long)puVar47 - (long)puVar42);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar36 - (int)puVar45;
      iVar32 = 0xd;
      puVar42 = puVar36;
      if (src < puVar36) {
        piVar24 = (int *)(pBVar9 + ((ulong)uVar40 - 1));
        do {
          puVar42 = puVar38;
          if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001745d7;
          pBVar53 = pBVar53 + 1;
        } while ((src < puVar42) &&
                (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
      }
    }
    else {
      iVar32 = 0;
      if ((char)uVar46 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        puVar45 = (ulong *)(pBVar11 + uVar41);
        if (puVar45 < mEnd) {
          if ((uVar6 < uVar41) && (*puVar45 == uVar35)) {
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar45 + 1),(BYTE *)iEnd,
                                (BYTE *)mEnd,(BYTE *)iStart);
            pBVar53 = (BYTE *)(sVar23 + 8);
            uVar37 = UVar30 - (uVar55 + uVar41);
            iVar32 = 0xd;
            puVar42 = puVar36;
            if (src < puVar36) {
              piVar24 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
              do {
                puVar42 = puVar38;
                if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001745d7;
                pBVar53 = pBVar53 + 1;
              } while ((src < puVar42) &&
                      (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                      puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
            }
          }
          goto LAB_00174256;
        }
        goto LAB_00175bc0;
      }
LAB_0017424a:
      iVar32 = 0;
    }
    goto LAB_00174256;
  }
  if (uVar34 == 6) {
    if (uVar41 < uVar40) goto LAB_00175b63;
    if (ms->prefetchCDictTables != 0) {
      if (uVar31 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar26 & 0x3f)));
      }
      if (uVar60 < 0x3e) {
        uVar35 = 0;
        do {
          uVar35 = uVar35 + 0x40;
        } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
      }
    }
    if (uVar52 < local_144) goto LAB_00175b82;
    puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
    if (uVar52 < local_11c) goto LAB_00175ba1;
    if (puVar21 <= puVar42) goto LAB_001759df;
    if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar37)) || (0x20 < uVar33))
    goto LAB_00175b44;
    bVar28 = 0x40 - cVar19;
    bVar29 = 0x40 - cVar20;
    puVar1 = (ulong *)((long)iEnd + -7);
    puVar2 = (ulong *)((long)iEnd + -3);
    puVar3 = (ulong *)((long)iEnd + -1);
    puVar22 = iEnd + -4;
    uVar37 = 0xbf9b0000;
LAB_00172c69:
    uVar35 = *puVar42;
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar51 = uVar35 * -0x30e4432340650000 >> (bVar29 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    uVar57 = uVar35 * -0x30e4432340650000 >> (0x38 - bVar27 & 0x3f);
    uVar40 = pUVar12[uVar46 >> 8];
    uVar41 = pUVar13[uVar57 >> 8];
    UVar54 = (int)puVar42 - iVar50;
    uVar33 = pUVar14[uVar49];
    UVar30 = UVar54 + 1;
    uVar31 = UVar30 - local_144;
    piVar58 = (int *)(pBVar9 + uVar31);
    if (uVar31 < uVar17) {
      piVar58 = (int *)(pBVar11 + (uVar31 - uVar55));
    }
    uVar60 = pUVar15[uVar51];
    pUVar15[uVar51] = UVar54;
    pUVar14[uVar49] = UVar54;
    if ((2 < (uVar17 - 1) - uVar31) && (*piVar58 == *(int *)((long)puVar42 + 1))) {
      puVar38 = iEnd;
      if (uVar31 < uVar17) {
        puVar38 = mEnd;
      }
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                          (BYTE *)puVar38,(BYTE *)iStart);
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          puVar42 = (ulong *)((long)puVar42 + 1);
          uVar35 = (long)puVar42 - (long)src;
          puVar38 = (ulong *)seqStore->lit;
          if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
            if (puVar42 <= iEnd) {
              if (puVar22 < puVar42) {
                ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
              }
              else {
                uVar46 = *(ulong *)((long)src + 8);
                *puVar38 = *src;
                puVar38[1] = uVar46;
                if (0x10 < uVar35) {
                  pBVar59 = seqStore->lit;
                  if (0xffffffffffffffe0 <
                      (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                  goto LAB_00175b06;
                  uVar46 = *(ulong *)((long)src + 0x18);
                  *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                  *(ulong *)(pBVar59 + 0x18) = uVar46;
                  if (0x20 < (long)uVar35) {
                    lVar39 = 0;
                    do {
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                      uVar18 = puVar5[1];
                      pBVar53 = pBVar59 + lVar39 + 0x20;
                      *(undefined8 *)pBVar53 = *puVar5;
                      *(undefined8 *)(pBVar53 + 8) = uVar18;
                      puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                      uVar18 = puVar5[1];
                      *(undefined8 *)(pBVar53 + 0x10) = *puVar5;
                      *(undefined8 *)(pBVar53 + 0x18) = uVar18;
                      lVar39 = lVar39 + 0x20;
                    } while (pBVar53 + 0x20 < pBVar59 + uVar35);
                  }
                }
              }
              seqStore->lit = seqStore->lit + uVar35;
              if (0xffff < uVar35) {
                if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
                seqStore->longLengthType = ZSTD_llt_literalLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3)
                ;
              }
              pBVar53 = (BYTE *)(sVar23 + 4);
              psVar25 = seqStore->sequences;
              psVar25->litLength = (U16)uVar35;
              psVar25->offBase = 1;
              if (pBVar53 < (BYTE *)0x3) goto LAB_00175a2d;
              pBVar59 = (BYTE *)(sVar23 + 1);
              if (pBVar59 < (BYTE *)0x10000) goto LAB_001737df;
              if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_001737b9;
              goto LAB_00175aa9;
            }
            goto LAB_00175a8a;
          }
          goto LAB_00175a6b;
        }
        goto LAB_00175a4c;
      }
      goto LAB_00175a0e;
    }
    puVar38 = puVar42;
    if (uVar33 <= uVar17) {
      if ((char)uVar46 != (char)uVar40) goto LAB_00172fa7;
      uVar40 = uVar40 >> 8;
      puVar38 = (ulong *)(pBVar11 + uVar40);
      if (puVar38 < mEnd) {
        iVar32 = 0;
        if ((uVar6 < uVar40) && (*puVar38 == uVar35)) {
          sVar23 = ZSTD_count_2segments
                             ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          pBVar53 = (BYTE *)(sVar23 + 8);
          uVar37 = UVar54 - (uVar40 + uVar55);
          iVar32 = 0xd;
          if (src < puVar42) {
            piVar58 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
            do {
              puVar38 = (ulong *)((long)puVar42 + -1);
              if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
                 (pBVar53 = pBVar53 + 1, puVar42 = puVar38, puVar38 <= src)) break;
              bVar16 = piVar44 < piVar58;
              piVar58 = (int *)((long)piVar58 + -1);
            } while (bVar16);
          }
        }
        if (iVar32 == 0xd) goto LAB_00173660;
        puVar38 = puVar42;
        if (iVar32 == 0) goto LAB_00172fa7;
        goto LAB_00173a38;
      }
      goto LAB_00175b25;
    }
    puVar36 = (ulong *)(pBVar9 + uVar33);
    if (*puVar36 == uVar35) {
      puVar38 = puVar42 + 1;
      puVar47 = puVar36 + 1;
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar47;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar47 == *puVar38) {
          puVar45 = puVar42 + 2;
          puVar47 = puVar36 + 2;
          do {
            if (puVar1 <= puVar45) goto LAB_00173200;
            uVar35 = *puVar47;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar47 = puVar47 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_00173200:
        if ((puVar45 < puVar2) && ((int)*puVar47 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar47 = (ulong *)((long)puVar47 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar47 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar47 = (ulong *)((long)puVar47 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar42 - (int)puVar36;
      if (src < puVar42) {
        piVar58 = (int *)(pBVar9 + ((ulong)uVar33 - 1));
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          if ((BYTE)*puVar38 != (BYTE)*piVar58) {
            puVar42 = (ulong *)((long)puVar38 + 1);
            goto LAB_00173660;
          }
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) &&
                (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1), puVar38 = puVar42
                , bVar16));
        goto LAB_001732a4;
      }
      goto LAB_00173660;
    }
LAB_00172fa7:
    if (uVar60 <= uVar17) {
      if ((char)uVar57 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        if ((uVar6 < uVar41) && (*(int *)(pBVar11 + uVar41) == (int)*puVar38)) {
          uVar60 = uVar41 + uVar55;
          piVar58 = (int *)(pBVar11 + uVar41);
          goto LAB_00172fc3;
        }
      }
LAB_00173106:
      puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
      goto LAB_00173a38;
    }
    piVar58 = (int *)(pBVar9 + uVar60);
    if (*piVar58 != (int)*puVar38) goto LAB_00173106;
LAB_00172fc3:
    uVar35 = *(ulong *)((long)puVar38 + 1);
    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
    puVar36 = (ulong *)((long)puVar38 + 1);
    uVar40 = pUVar14[uVar49];
    uVar41 = pUVar12[uVar46 >> 8];
    pUVar14[uVar49] = UVar30;
    puVar42 = puVar38;
    if (uVar17 < uVar40) {
      puVar45 = (ulong *)(pBVar9 + uVar40);
      if (*puVar45 != uVar35) goto LAB_001732b6;
      puVar42 = (ulong *)((long)puVar38 + 9);
      puVar48 = puVar45 + 1;
      puVar47 = puVar42;
      if (puVar42 < puVar1) {
        uVar46 = *puVar42 ^ *puVar48;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar48 == *puVar42) {
          puVar47 = (ulong *)((long)puVar38 + 0x11);
          puVar48 = puVar45 + 2;
          do {
            if (puVar1 <= puVar47) goto LAB_001734e5;
            uVar35 = *puVar48;
            uVar46 = *puVar47;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar47 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar42));
            puVar47 = puVar47 + 1;
            puVar48 = puVar48 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_001734e5:
        if ((puVar47 < puVar2) && ((int)*puVar48 == (int)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 4);
          puVar48 = (ulong *)((long)puVar48 + 4);
        }
        if ((puVar47 < puVar3) && ((short)*puVar48 == (short)*puVar47)) {
          puVar47 = (ulong *)((long)puVar47 + 2);
          puVar48 = (ulong *)((long)puVar48 + 2);
        }
        if (puVar47 < iEnd) {
          puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar48 == (BYTE)*puVar47));
        }
        pBVar53 = (BYTE *)((long)puVar47 - (long)puVar42);
      }
      pBVar53 = pBVar53 + 8;
      uVar37 = (int)puVar36 - (int)puVar45;
      iVar32 = 0xd;
      puVar42 = puVar36;
      if (src < puVar36) {
        piVar24 = (int *)(pBVar9 + ((ulong)uVar40 - 1));
        do {
          puVar42 = puVar38;
          if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_0017363b;
          pBVar53 = pBVar53 + 1;
        } while ((src < puVar42) &&
                (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
      }
    }
    else {
      iVar32 = 0;
      if ((char)uVar46 == (char)uVar41) {
        uVar41 = uVar41 >> 8;
        puVar45 = (ulong *)(pBVar11 + uVar41);
        if (puVar45 < mEnd) {
          if ((uVar6 < uVar41) && (*puVar45 == uVar35)) {
            sVar23 = ZSTD_count_2segments
                               ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar45 + 1),(BYTE *)iEnd,
                                (BYTE *)mEnd,(BYTE *)iStart);
            pBVar53 = (BYTE *)(sVar23 + 8);
            uVar37 = UVar30 - (uVar55 + uVar41);
            iVar32 = 0xd;
            puVar42 = puVar36;
            if (src < puVar36) {
              piVar24 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
              do {
                puVar42 = puVar38;
                if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_0017363b;
                pBVar53 = pBVar53 + 1;
              } while ((src < puVar42) &&
                      (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                      puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
            }
          }
          goto LAB_001732c2;
        }
        goto LAB_00175bc0;
      }
LAB_001732b6:
      iVar32 = 0;
    }
    goto LAB_001732c2;
  }
  if (uVar34 == 7) {
    if (uVar40 <= uVar41) {
      if (ms->prefetchCDictTables != 0) {
        if (uVar31 < 0x3e) {
          uVar35 = 0;
          do {
            uVar35 = uVar35 + 0x40;
          } while (uVar35 < (ulong)(4L << (bVar26 & 0x3f)));
        }
        if (uVar60 < 0x3e) {
          uVar35 = 0;
          do {
            uVar35 = uVar35 + 0x40;
          } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
        }
      }
      if (local_144 <= uVar52) {
        puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
        if (local_11c <= uVar52) {
          if (puVar42 < puVar21) {
            if ((((uVar7 < 0x21) && (uVar8 < 0x21)) && (uVar37 < 0x21)) && (uVar33 < 0x21)) {
              bVar28 = 0x40 - cVar19;
              bVar29 = 0x40 - cVar20;
              puVar1 = (ulong *)((long)iEnd - 7);
              puVar2 = (ulong *)((long)iEnd - 3);
              puVar3 = (ulong *)((long)iEnd - 1);
              puVar22 = iEnd + -4;
              uVar37 = 0xbfa56300;
LAB_00171cc9:
              uVar35 = *puVar42;
              uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
              uVar51 = uVar35 * -0x30e44323405a9d00 >> (bVar29 & 0x3f);
              uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
              uVar57 = uVar35 * -0x30e44323405a9d00 >> (0x38 - bVar27 & 0x3f);
              uVar40 = pUVar12[uVar46 >> 8];
              uVar41 = pUVar13[uVar57 >> 8];
              UVar54 = (int)puVar42 - iVar50;
              uVar33 = pUVar14[uVar49];
              UVar30 = UVar54 + 1;
              uVar31 = UVar30 - local_144;
              piVar58 = (int *)(pBVar9 + uVar31);
              if (uVar31 < uVar17) {
                piVar58 = (int *)(pBVar11 + (uVar31 - uVar55));
              }
              uVar60 = pUVar15[uVar51];
              pUVar15[uVar51] = UVar54;
              pUVar14[uVar49] = UVar54;
              if (((uVar17 - 1) - uVar31 < 3) || (*piVar58 != *(int *)((long)puVar42 + 1))) {
                puVar38 = puVar42;
                if (uVar17 < uVar33) {
                  puVar36 = (ulong *)(pBVar9 + uVar33);
                  if (*puVar36 != uVar35) {
LAB_00172011:
                    if (uVar60 <= uVar17) {
                      if ((char)uVar57 == (char)uVar41) {
                        uVar41 = uVar41 >> 8;
                        if ((uVar6 < uVar41) && (*(int *)(pBVar11 + uVar41) == (int)*puVar38)) {
                          uVar60 = uVar41 + uVar55;
                          piVar58 = (int *)(pBVar11 + uVar41);
                          goto LAB_0017202c;
                        }
                      }
LAB_0017216f:
                      puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
                      goto LAB_00172aa8;
                    }
                    piVar58 = (int *)(pBVar9 + uVar60);
                    if (*piVar58 != (int)*puVar38) goto LAB_0017216f;
LAB_0017202c:
                    uVar35 = *(ulong *)((long)puVar38 + 1);
                    uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
                    uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
                    puVar36 = (ulong *)((long)puVar38 + 1);
                    uVar40 = pUVar14[uVar49];
                    uVar41 = pUVar12[uVar46 >> 8];
                    pUVar14[uVar49] = UVar30;
                    puVar42 = puVar38;
                    if (uVar17 < uVar40) {
                      puVar45 = (ulong *)(pBVar9 + uVar40);
                      if (*puVar45 == uVar35) {
                        puVar42 = (ulong *)((long)puVar38 + 9);
                        puVar48 = puVar45 + 1;
                        puVar47 = puVar42;
                        if (puVar42 < puVar1) {
                          uVar46 = *puVar42 ^ *puVar48;
                          uVar35 = 0;
                          if (uVar46 != 0) {
                            for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                            }
                          }
                          pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                          if (*puVar48 == *puVar42) {
                            puVar47 = (ulong *)((long)puVar38 + 0x11);
                            puVar48 = puVar45 + 2;
                            do {
                              if (puVar1 <= puVar47) goto LAB_00172552;
                              uVar35 = *puVar48;
                              uVar46 = *puVar47;
                              uVar51 = uVar46 ^ uVar35;
                              uVar49 = 0;
                              if (uVar51 != 0) {
                                for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                                }
                              }
                              pBVar53 = (BYTE *)((long)puVar47 +
                                                ((uVar49 >> 3 & 0x1fffffff) - (long)puVar42));
                              puVar47 = puVar47 + 1;
                              puVar48 = puVar48 + 1;
                            } while (uVar35 == uVar46);
                          }
                        }
                        else {
LAB_00172552:
                          if ((puVar47 < puVar2) && ((int)*puVar48 == (int)*puVar47)) {
                            puVar47 = (ulong *)((long)puVar47 + 4);
                            puVar48 = (ulong *)((long)puVar48 + 4);
                          }
                          if ((puVar47 < puVar3) && ((short)*puVar48 == (short)*puVar47)) {
                            puVar47 = (ulong *)((long)puVar47 + 2);
                            puVar48 = (ulong *)((long)puVar48 + 2);
                          }
                          if (puVar47 < iEnd) {
                            puVar47 = (ulong *)((long)puVar47 +
                                               (ulong)((BYTE)*puVar48 == (BYTE)*puVar47));
                          }
                          pBVar53 = (BYTE *)((long)puVar47 - (long)puVar42);
                        }
                        pBVar53 = pBVar53 + 8;
                        uVar37 = (int)puVar36 - (int)puVar45;
                        iVar32 = 0xd;
                        puVar42 = puVar36;
                        if (src < puVar36) {
                          piVar24 = (int *)(pBVar9 + ((ulong)uVar40 - 1));
                          do {
                            puVar42 = puVar38;
                            puVar38 = puVar42;
                            if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001726a6;
                            pBVar53 = pBVar53 + 1;
                          } while ((src < puVar42) &&
                                  (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                                  puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
                        }
                      }
                      else {
LAB_00172319:
                        iVar32 = 0;
                      }
                    }
                    else {
                      iVar32 = 0;
                      if ((char)uVar46 != (char)uVar41) goto LAB_00172319;
                      uVar41 = uVar41 >> 8;
                      puVar45 = (ulong *)(pBVar11 + uVar41);
                      if (mEnd <= puVar45) {
LAB_00175bc0:
                        __assert_fail("dictMatchL3 < dictEnd",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                      ,0x6e86,
                                      "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                                     );
                      }
                      if ((uVar6 < uVar41) && (*puVar45 == uVar35)) {
                        sVar23 = ZSTD_count_2segments
                                           ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar45 + 1),
                                            (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                        pBVar53 = (BYTE *)(sVar23 + 8);
                        uVar37 = UVar30 - (uVar55 + uVar41);
                        iVar32 = 0xd;
                        puVar42 = puVar36;
                        if (src < puVar36) {
                          piVar24 = (int *)(pBVar11 + ((ulong)uVar41 - 1));
                          do {
                            if ((BYTE)*puVar38 != (BYTE)*piVar24) goto LAB_001726a6;
                            pBVar53 = pBVar53 + 1;
                            puVar42 = puVar38;
                          } while ((src < puVar38) &&
                                  (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1)
                                  , puVar38 = (ulong *)((long)puVar38 + -1), bVar16));
                        }
                      }
                    }
                    goto LAB_00172325;
                  }
                  puVar38 = puVar42 + 1;
                  puVar47 = puVar36 + 1;
                  puVar45 = puVar38;
                  if (puVar38 < puVar1) {
                    uVar46 = *puVar38 ^ *puVar47;
                    uVar35 = 0;
                    if (uVar46 != 0) {
                      for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
                      }
                    }
                    pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
                    if (*puVar47 == *puVar38) {
                      puVar45 = puVar42 + 2;
                      puVar47 = puVar36 + 2;
                      do {
                        if (puVar1 <= puVar45) goto LAB_00172269;
                        uVar35 = *puVar47;
                        uVar46 = *puVar45;
                        uVar51 = uVar46 ^ uVar35;
                        uVar49 = 0;
                        if (uVar51 != 0) {
                          for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
                          }
                        }
                        pBVar53 = (BYTE *)((long)puVar45 +
                                          ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
                        puVar45 = puVar45 + 1;
                        puVar47 = puVar47 + 1;
                      } while (uVar35 == uVar46);
                    }
                  }
                  else {
LAB_00172269:
                    if ((puVar45 < puVar2) && ((int)*puVar47 == (int)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 4);
                      puVar47 = (ulong *)((long)puVar47 + 4);
                    }
                    if ((puVar45 < puVar3) && ((short)*puVar47 == (short)*puVar45)) {
                      puVar45 = (ulong *)((long)puVar45 + 2);
                      puVar47 = (ulong *)((long)puVar47 + 2);
                    }
                    if (puVar45 < iEnd) {
                      puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar47 == (BYTE)*puVar45))
                      ;
                    }
                    pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
                  }
                  pBVar53 = pBVar53 + 8;
                  uVar37 = (int)puVar42 - (int)puVar36;
                  if (src < puVar42) {
                    piVar58 = (int *)(pBVar9 + ((ulong)uVar33 - 1));
                    puVar38 = (ulong *)((long)puVar42 + -1);
                    do {
                      if ((BYTE)*puVar38 != (BYTE)*piVar58) {
                        puVar42 = (ulong *)((long)puVar38 + 1);
                        goto LAB_001726cb;
                      }
                      pBVar53 = pBVar53 + 1;
                      puVar42 = (ulong *)((long)puVar38 + -1);
                    } while ((src < puVar38) &&
                            (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1),
                            puVar38 = puVar42, bVar16));
                    goto LAB_00172307;
                  }
                  goto LAB_001726cb;
                }
                if ((char)uVar46 != (char)uVar40) goto LAB_00172011;
                uVar40 = uVar40 >> 8;
                puVar38 = (ulong *)(pBVar11 + uVar40);
                if (mEnd <= puVar38) {
LAB_00175b25:
                  __assert_fail("dictMatchL < dictEnd",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                                ,0x6e52,
                                "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                               );
                }
                iVar32 = 0;
                if ((uVar6 < uVar40) && (*puVar38 == uVar35)) {
                  sVar23 = ZSTD_count_2segments
                                     ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,
                                      (BYTE *)mEnd,(BYTE *)iStart);
                  pBVar53 = (BYTE *)(sVar23 + 8);
                  uVar37 = UVar54 - (uVar40 + uVar55);
                  iVar32 = 0xd;
                  if (src < puVar42) {
                    piVar58 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
                    do {
                      puVar38 = (ulong *)((long)puVar42 + -1);
                      if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
                         (pBVar53 = pBVar53 + 1, puVar42 = puVar38, puVar38 <= src)) break;
                      bVar16 = piVar44 < piVar58;
                      piVar58 = (int *)((long)piVar58 + -1);
                    } while (bVar16);
                  }
                }
                if (iVar32 == 0xd) goto LAB_001726cb;
                puVar38 = puVar42;
                if (iVar32 == 0) goto LAB_00172011;
                goto LAB_00172aa8;
              }
              puVar38 = iEnd;
              if (uVar31 < uVar17) {
                puVar38 = mEnd;
              }
              sVar23 = ZSTD_count_2segments
                                 ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                                  (BYTE *)puVar38,(BYTE *)iStart);
              if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
                  seqStore->maxNbSeq) {
                if (seqStore->maxNbLit < 0x20001) {
                  puVar42 = (ulong *)((long)puVar42 + 1);
                  uVar35 = (long)puVar42 - (long)src;
                  puVar38 = (ulong *)seqStore->lit;
                  if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
                    if (puVar42 <= iEnd) {
                      if (puVar22 < puVar42) {
                        ZSTD_safecopyLiterals
                                  ((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
                      }
                      else {
                        uVar46 = *(ulong *)((long)src + 8);
                        *puVar38 = *src;
                        puVar38[1] = uVar46;
                        if (0x10 < uVar35) {
                          pBVar59 = seqStore->lit;
                          if (0xffffffffffffffe0 <
                              (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                          goto LAB_00175b06;
                          uVar46 = *(ulong *)((long)src + 0x18);
                          *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                          *(ulong *)(pBVar59 + 0x18) = uVar46;
                          if (0x20 < (long)uVar35) {
                            lVar39 = 0;
                            do {
                              puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                              uVar18 = puVar5[1];
                              pBVar53 = pBVar59 + lVar39 + 0x20;
                              *(undefined8 *)pBVar53 = *puVar5;
                              *(undefined8 *)(pBVar53 + 8) = uVar18;
                              puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                              uVar18 = puVar5[1];
                              *(undefined8 *)(pBVar53 + 0x10) = *puVar5;
                              *(undefined8 *)(pBVar53 + 0x18) = uVar18;
                              lVar39 = lVar39 + 0x20;
                            } while (pBVar53 + 0x20 < pBVar59 + uVar35);
                          }
                        }
                      }
                      seqStore->lit = seqStore->lit + uVar35;
                      if (0xffff < uVar35) {
                        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
                        seqStore->longLengthType = ZSTD_llt_literalLength;
                        seqStore->longLengthPos =
                             (U32)((ulong)((long)seqStore->sequences -
                                          (long)seqStore->sequencesStart) >> 3);
                      }
                      pBVar53 = (BYTE *)(sVar23 + 4);
                      psVar25 = seqStore->sequences;
                      psVar25->litLength = (U16)uVar35;
                      psVar25->offBase = 1;
                      if (pBVar53 < (BYTE *)0x3) goto LAB_00175a2d;
                      pBVar59 = (BYTE *)(sVar23 + 1);
                      if (pBVar59 < (BYTE *)0x10000) goto LAB_00172843;
                      if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_0017281d;
                      goto LAB_00175aa9;
                    }
                    goto LAB_00175a8a;
                  }
                  goto LAB_00175a6b;
                }
                goto LAB_00175a4c;
              }
              goto LAB_00175a0e;
            }
LAB_00175b44:
            __assert_fail("hBits <= 32",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x4730,"size_t ZSTD_hashPtr(const void *, U32, U32)");
          }
LAB_001759df:
          *rep = local_144;
          rep[1] = local_11c;
          return (long)iEnd - (long)src;
        }
LAB_00175ba1:
        __assert_fail("offset_2 <= dictAndPrefixLength",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x6e23,
                      "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                     );
      }
LAB_00175b82:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x6e22,
                    "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                   );
    }
LAB_00175b63:
    __assert_fail("ms->window.dictLimit + (1U << cParams->windowLog) >= endIndex",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6e14,
                  "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (uVar41 < uVar40) goto LAB_00175b63;
  if (ms->prefetchCDictTables != 0) {
    pBVar59 = (BYTE *)(4L << (bVar26 & 0x3f));
    if (uVar31 < 0x3e) {
      pBVar53 = (BYTE *)0x0;
      do {
        pBVar53 = pBVar53 + 0x40;
      } while (pBVar53 < pBVar59);
    }
    if (uVar60 < 0x3e) {
      uVar35 = 0;
      do {
        uVar35 = uVar35 + 0x40;
      } while (uVar35 < (ulong)(4L << (bVar27 & 0x3f)));
    }
  }
  if (uVar52 < local_144) goto LAB_00175b82;
  puVar42 = (ulong *)((long)src + (ulong)(uVar52 == 0));
  if (uVar52 < local_11c) goto LAB_00175ba1;
  if (puVar21 <= puVar42) goto LAB_001759df;
  if ((((0x20 < uVar7) || (0x20 < uVar8)) || (0x20 < uVar37)) || (0x20 < uVar33)) goto LAB_00175b44;
  bVar28 = 0x40 - cVar19;
  bVar29 = 0x20 - cVar20;
  puVar1 = (ulong *)((long)iEnd + -7);
  puVar2 = (ulong *)((long)iEnd + -3);
  puVar3 = (ulong *)((long)iEnd + -1);
  puVar22 = iEnd + -4;
  pBVar53 = pBVar9 + -1;
  local_130 = pBVar53;
LAB_00174b89:
  uVar46 = *puVar42 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
  uVar31 = (int)*puVar42 * -0x61c8864f;
  uVar60 = uVar31 >> (bVar29 & 0x1f);
  uVar35 = *puVar42 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
  uVar31 = uVar31 >> (0x18 - bVar27 & 0x1f);
  uVar37 = pUVar12[uVar35 >> 8];
  uVar40 = pUVar13[uVar31 >> 8];
  UVar54 = (int)puVar42 - iVar50;
  uVar41 = pUVar14[uVar46];
  UVar30 = UVar54 + 1;
  uVar33 = UVar30 - local_144;
  piVar58 = (int *)(pBVar9 + uVar33);
  if (uVar33 < uVar17) {
    piVar58 = (int *)(pBVar11 + (uVar33 - uVar55));
  }
  uVar34 = pUVar15[uVar60];
  pUVar15[uVar60] = UVar54;
  pUVar14[uVar46] = UVar54;
  if ((2 < (uVar17 - 1) - uVar33) && (*piVar58 == *(int *)((long)puVar42 + 1))) {
    puVar38 = iEnd;
    if (uVar33 < uVar17) {
      puVar38 = mEnd;
    }
    sVar23 = ZSTD_count_2segments
                       ((BYTE *)((long)puVar42 + 5),(BYTE *)(piVar58 + 1),(BYTE *)iEnd,
                        (BYTE *)puVar38,(BYTE *)iStart);
    if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
        seqStore->maxNbSeq) {
      if (seqStore->maxNbLit < 0x20001) {
        puVar42 = (ulong *)((long)puVar42 + 1);
        uVar35 = (long)puVar42 - (long)src;
        puVar38 = (ulong *)seqStore->lit;
        if ((BYTE *)((long)puVar38 + uVar35) <= seqStore->litStart + seqStore->maxNbLit) {
          if (puVar42 <= iEnd) {
            if (puVar22 < puVar42) {
              ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
            }
            else {
              uVar46 = *(ulong *)((long)src + 8);
              *puVar38 = *src;
              puVar38[1] = uVar46;
              if (0x10 < uVar35) {
                pBVar59 = seqStore->lit;
                if (0xffffffffffffffe0 <
                    (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
                goto LAB_00175b06;
                uVar46 = *(ulong *)((long)src + 0x18);
                *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
                *(ulong *)(pBVar59 + 0x18) = uVar46;
                if (0x20 < (long)uVar35) {
                  lVar39 = 0;
                  do {
                    puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
                    uVar18 = puVar5[1];
                    pBVar43 = pBVar59 + lVar39 + 0x20;
                    *(undefined8 *)pBVar43 = *puVar5;
                    *(undefined8 *)(pBVar43 + 8) = uVar18;
                    puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
                    uVar18 = puVar5[1];
                    *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
                    *(undefined8 *)(pBVar43 + 0x18) = uVar18;
                    lVar39 = lVar39 + 0x20;
                  } while (pBVar43 + 0x20 < pBVar59 + uVar35);
                }
              }
            }
            seqStore->lit = seqStore->lit + uVar35;
            if (0xffff < uVar35) {
              if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
              seqStore->longLengthType = ZSTD_llt_literalLength;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
            pBVar59 = (BYTE *)(sVar23 + 4);
            psVar25 = seqStore->sequences;
            psVar25->litLength = (U16)uVar35;
            psVar25->offBase = 1;
            if (pBVar59 < (BYTE *)0x3) goto LAB_00175a2d;
            pBVar43 = (BYTE *)(sVar23 + 1);
            if (pBVar43 < (BYTE *)0x10000) goto LAB_0017575b;
            if (seqStore->longLengthType == ZSTD_llt_none) goto LAB_00175735;
            goto LAB_00175aa9;
          }
          goto LAB_00175a8a;
        }
        goto LAB_00175a6b;
      }
      goto LAB_00175a4c;
    }
    goto LAB_00175a0e;
  }
  puVar38 = puVar42;
  if (uVar41 <= uVar17) {
    if ((char)uVar35 != (char)uVar37) goto LAB_00174ee9;
    uVar37 = uVar37 >> 8;
    puVar38 = (ulong *)(pBVar11 + uVar37);
    if (puVar38 < mEnd) {
      iVar32 = 0;
      if ((uVar6 < uVar37) && (iVar32 = 0, *puVar38 == *puVar42)) {
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)(puVar42 + 1),(BYTE *)(puVar38 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                            (BYTE *)iStart);
        pBVar59 = (BYTE *)(sVar23 + 8);
        local_130 = (BYTE *)(ulong)(UVar54 - (uVar37 + uVar55));
        iVar32 = 0xd;
        if (src < puVar42) {
          piVar58 = (int *)(pBVar11 + ((ulong)uVar37 - 1));
          do {
            puVar38 = (ulong *)((long)puVar42 + -1);
            if ((*(BYTE *)puVar38 != (BYTE)*piVar58) ||
               (pBVar59 = pBVar59 + 1, puVar42 = puVar38, puVar38 <= src)) break;
            bVar16 = piVar44 < piVar58;
            piVar58 = (int *)((long)piVar58 + -1);
          } while (bVar16);
        }
      }
      if (iVar32 == 0xd) goto LAB_001755e3;
      puVar38 = puVar42;
      if (iVar32 == 0) goto LAB_00174ee9;
      goto LAB_001759b6;
    }
    goto LAB_00175b25;
  }
  puVar36 = (ulong *)(pBVar9 + uVar41);
  if (*puVar36 == *puVar42) {
    puVar45 = puVar42 + 1;
    puVar38 = puVar36 + 1;
    puVar47 = puVar45;
    if (puVar45 < puVar1) {
      uVar46 = *puVar45 ^ *puVar38;
      uVar35 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      pBVar59 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
      if (*puVar38 == *puVar45) {
        puVar47 = puVar42 + 2;
        puVar38 = puVar36 + 2;
        do {
          if (puVar1 <= puVar47) goto LAB_0017514b;
          uVar35 = *puVar38;
          uVar46 = *puVar47;
          uVar51 = uVar46 ^ uVar35;
          uVar49 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          pBVar59 = (BYTE *)((long)puVar47 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar45));
          puVar47 = puVar47 + 1;
          puVar38 = puVar38 + 1;
        } while (uVar35 == uVar46);
      }
    }
    else {
LAB_0017514b:
      if ((puVar47 < puVar2) && ((int)*puVar38 == (int)*puVar47)) {
        puVar47 = (ulong *)((long)puVar47 + 4);
        puVar38 = (ulong *)((long)puVar38 + 4);
      }
      if ((puVar47 < puVar3) && ((short)*puVar38 == (short)*puVar47)) {
        puVar47 = (ulong *)((long)puVar47 + 2);
        puVar38 = (ulong *)((long)puVar38 + 2);
      }
      if (puVar47 < iEnd) {
        puVar47 = (ulong *)((long)puVar47 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar47));
      }
      pBVar59 = (BYTE *)((long)puVar47 - (long)puVar45);
    }
    pBVar59 = pBVar59 + 8;
    local_130 = (BYTE *)(ulong)(uint)((int)puVar42 - (int)puVar36);
    if (src < puVar42) {
      piVar58 = (int *)(pBVar53 + uVar41);
      puVar38 = (ulong *)((long)puVar42 + -1);
      do {
        if ((BYTE)*puVar38 != (BYTE)*piVar58) {
          puVar42 = (ulong *)((long)puVar38 + 1);
          goto LAB_001755e3;
        }
        pBVar59 = pBVar59 + 1;
        puVar42 = (ulong *)((long)puVar38 + -1);
      } while ((src < puVar38) &&
              (bVar16 = iStart < piVar58, piVar58 = (int *)((long)piVar58 + -1), puVar38 = puVar42,
              bVar16));
      goto LAB_001751eb;
    }
    goto LAB_001755e3;
  }
LAB_00174ee9:
  if (uVar34 <= uVar17) {
    if ((char)uVar31 == (char)uVar40) {
      uVar40 = uVar40 >> 8;
      if ((uVar6 < uVar40) && (*(int *)(pBVar11 + uVar40) == (int)*puVar38)) {
        uVar34 = uVar40 + uVar55;
        piVar58 = (int *)(pBVar11 + uVar40);
        goto LAB_00174f05;
      }
    }
LAB_00175050:
    puVar42 = (ulong *)((long)puVar38 + ((long)puVar38 - (long)src >> 8) + 1);
    goto LAB_001759b6;
  }
  piVar58 = (int *)(pBVar9 + uVar34);
  if (*piVar58 != (int)*puVar38) goto LAB_00175050;
LAB_00174f05:
  uVar35 = *(ulong *)((long)puVar38 + 1);
  uVar49 = uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f);
  uVar46 = uVar35 * -0x30e44323485a9b9d >> (0x38 - bVar26 & 0x3f);
  puVar42 = (ulong *)((long)puVar38 + 1);
  uVar37 = pUVar14[uVar49];
  uVar40 = pUVar12[uVar46 >> 8];
  pUVar14[uVar49] = UVar30;
  if (uVar37 <= uVar17) {
    if ((char)uVar46 == (char)uVar40) {
      uVar40 = uVar40 >> 8;
      puVar36 = (ulong *)(pBVar11 + uVar40);
      if (mEnd <= puVar36) goto LAB_00175bc0;
      if ((uVar6 < uVar40) && (*puVar36 == uVar35)) {
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar38 + 9),(BYTE *)(puVar36 + 1),(BYTE *)iEnd,
                            (BYTE *)mEnd,(BYTE *)iStart);
        pBVar59 = (BYTE *)(sVar23 + 8);
        uVar41 = UVar30 - (uVar55 + uVar40);
        iVar32 = 0xd;
        if (src < puVar42) {
          piVar24 = (int *)(pBVar11 + ((ulong)uVar40 - 1));
          do {
            puVar42 = puVar38;
            if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001755a0;
            pBVar59 = pBVar59 + 1;
          } while ((src < puVar42) &&
                  (bVar16 = piVar44 < piVar24, piVar24 = (int *)((long)piVar24 + -1),
                  puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
        }
        goto LAB_001752cd;
      }
    }
LAB_001752c5:
    iVar32 = 0;
    uVar41 = (uint)local_130;
    puVar42 = puVar38;
    goto LAB_001752cd;
  }
  puVar36 = (ulong *)(pBVar9 + uVar37);
  if (*puVar36 != uVar35) goto LAB_001752c5;
  puVar47 = (ulong *)((long)puVar38 + 9);
  puVar45 = puVar36 + 1;
  puVar48 = puVar47;
  if (puVar47 < puVar1) {
    uVar46 = *puVar47 ^ *puVar45;
    uVar35 = 0;
    if (uVar46 != 0) {
      for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
      }
    }
    pBVar59 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
    if (*puVar45 == *puVar47) {
      puVar48 = (ulong *)((long)puVar38 + 0x11);
      puVar45 = puVar36 + 2;
      do {
        if (puVar1 <= puVar48) goto LAB_0017543c;
        uVar35 = *puVar45;
        uVar46 = *puVar48;
        uVar51 = uVar46 ^ uVar35;
        uVar49 = 0;
        if (uVar51 != 0) {
          for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
          }
        }
        pBVar59 = (BYTE *)((long)puVar48 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar47));
        puVar48 = puVar48 + 1;
        puVar45 = puVar45 + 1;
      } while (uVar35 == uVar46);
    }
  }
  else {
LAB_0017543c:
    if ((puVar48 < puVar2) && ((int)*puVar45 == (int)*puVar48)) {
      puVar48 = (ulong *)((long)puVar48 + 4);
      puVar45 = (ulong *)((long)puVar45 + 4);
    }
    if ((puVar48 < puVar3) && ((short)*puVar45 == (short)*puVar48)) {
      puVar48 = (ulong *)((long)puVar48 + 2);
      puVar45 = (ulong *)((long)puVar45 + 2);
    }
    if (puVar48 < iEnd) {
      puVar48 = (ulong *)((long)puVar48 + (ulong)((BYTE)*puVar45 == (BYTE)*puVar48));
    }
    pBVar59 = (BYTE *)((long)puVar48 - (long)puVar47);
  }
  pBVar59 = pBVar59 + 8;
  uVar41 = (int)puVar42 - (int)puVar36;
  iVar32 = 0xd;
  if (src < puVar42) {
    piVar24 = (int *)(pBVar53 + uVar37);
    do {
      puVar42 = puVar38;
      if ((BYTE)*puVar42 != (BYTE)*piVar24) goto LAB_001755a0;
      pBVar59 = pBVar59 + 1;
    } while ((src < puVar42) &&
            (bVar16 = iStart < piVar24, piVar24 = (int *)((long)piVar24 + -1),
            puVar38 = (ulong *)((long)puVar42 + -1), bVar16));
  }
LAB_001752cd:
  if (iVar32 == 0xd) {
    local_130 = (BYTE *)(ulong)uVar41;
    goto LAB_001755e3;
  }
  if (iVar32 != 0) {
    local_130 = (BYTE *)(ulong)uVar41;
    goto LAB_001759b6;
  }
  puVar36 = (ulong *)((long)puVar42 + 4);
  puVar38 = (ulong *)(piVar58 + 1);
  if (uVar34 < uVar17) {
    sVar23 = ZSTD_count_2segments
                       ((BYTE *)puVar36,(BYTE *)puVar38,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
    pBVar59 = (BYTE *)(sVar23 + 4);
    local_130 = (BYTE *)(ulong)(UVar54 - uVar34);
    if ((piVar44 < piVar58) && (src < puVar42)) {
      puVar38 = (ulong *)((long)puVar42 + -1);
      do {
        piVar58 = (int *)((long)piVar58 + -1);
        if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_00175598;
        pBVar59 = pBVar59 + 1;
        puVar42 = (ulong *)((long)puVar38 + -1);
      } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_001751eb:
      puVar42 = (ulong *)((long)puVar42 + 1);
    }
  }
  else {
    puVar45 = puVar36;
    if (puVar36 < puVar1) {
      uVar46 = *puVar36 ^ *puVar38;
      uVar35 = 0;
      if (uVar46 != 0) {
        for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
        }
      }
      pBVar59 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
      if (*puVar38 == *puVar36) {
        puVar45 = (ulong *)((long)puVar42 + 0xc);
        puVar38 = (ulong *)(piVar58 + 3);
        do {
          if (puVar1 <= puVar45) goto LAB_001754f4;
          uVar35 = *puVar38;
          uVar46 = *puVar45;
          uVar51 = uVar46 ^ uVar35;
          uVar49 = 0;
          if (uVar51 != 0) {
            for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
            }
          }
          pBVar59 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar36));
          puVar45 = puVar45 + 1;
          puVar38 = puVar38 + 1;
        } while (uVar35 == uVar46);
      }
    }
    else {
LAB_001754f4:
      if ((puVar45 < puVar2) && ((int)*puVar38 == (int)*puVar45)) {
        puVar45 = (ulong *)((long)puVar45 + 4);
        puVar38 = (ulong *)((long)puVar38 + 4);
      }
      if ((puVar45 < puVar3) && ((short)*puVar38 == (short)*puVar45)) {
        puVar45 = (ulong *)((long)puVar45 + 2);
        puVar38 = (ulong *)((long)puVar38 + 2);
      }
      if (puVar45 < iEnd) {
        puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar38 == (BYTE)*puVar45));
      }
      pBVar59 = (BYTE *)((long)puVar45 - (long)puVar36);
    }
    pBVar59 = pBVar59 + 4;
    local_130 = (BYTE *)(ulong)(uint)((int)puVar42 - (int)piVar58);
    if ((iStart < piVar58) && (src < puVar42)) {
      puVar38 = (ulong *)((long)puVar42 + -1);
      do {
        piVar58 = (int *)((long)piVar58 + -1);
        if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_00175598;
        pBVar59 = pBVar59 + 1;
        puVar42 = (ulong *)((long)puVar38 + -1);
      } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
      goto LAB_001751eb;
    }
  }
LAB_001755e3:
  if ((uint)local_130 == 0) goto LAB_00175ac8;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00175a0e;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) goto LAB_00175a6b;
  if (iEnd < puVar42) goto LAB_00175a8a;
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar43 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar43 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_00175b06;
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar43 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar43 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar4 = pBVar43 + lVar39 + 0x20;
          *(undefined8 *)pBVar4 = *puVar5;
          *(undefined8 *)(pBVar4 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar4 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar4 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar4 + 0x20 < pBVar43 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = (uint)local_130 + 3;
  if (pBVar59 < (BYTE *)0x3) goto LAB_00175a2d;
  pBVar43 = pBVar59 + -3;
  local_11c = local_144;
  local_144 = (uint)local_130;
  if ((BYTE *)0xffff < pBVar43) {
    local_144 = (uint)local_130;
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
LAB_00175735:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_0017575b:
  psVar25->mlBase = (U16)pBVar43;
  seqStore->sequences = psVar25 + 1;
  src = (void *)((long)puVar42 + (long)pBVar59);
  puVar42 = (ulong *)src;
  if (src <= puVar21) {
    uVar37 = UVar54 + 2;
    pUVar14[(ulong)(*(long *)(pBVar9 + uVar37) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar37;
    pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)src + -2) - iVar50;
    pUVar15[(uint)(*(int *)(pBVar9 + uVar37) * -0x61c8864f) >> (bVar29 & 0x1f)] = uVar37;
    pUVar15[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar29 & 0x1f)] =
         ((int)src + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar37 = UVar30 - local_11c;
      pBVar43 = pBVar9;
      if (uVar37 < uVar17) {
        pBVar43 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar37 < 3) || (*(int *)(pBVar43 + uVar37) != (int)*puVar42)) {
        bVar16 = false;
        uVar37 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar37 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar43 + uVar37) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00175a0e;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_00175a6b;
        if (iEnd < src) goto LAB_00175a8a;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_00175a2d;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        pUVar15[(uint)((int)*puVar42 * -0x61c8864f) >> (bVar29 & 0x1f)] = UVar30;
        pUVar14[*puVar42 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        src = (void *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        puVar42 = (ulong *)src;
        uVar37 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar37;
    } while (bVar16);
  }
LAB_001759b6:
  if (puVar21 <= puVar42) goto LAB_001759df;
  goto LAB_00174b89;
LAB_001745d7:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar42 + 1);
LAB_00174256:
  if (iVar32 != 0xd) {
    if (iVar32 != 0) goto LAB_001749d9;
    puVar38 = (ulong *)((long)puVar42 + 4);
    puVar36 = (ulong *)(piVar58 + 1);
    if (uVar60 < uVar17) {
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)puVar38,(BYTE *)puVar36,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pBVar53 = (BYTE *)(sVar23 + 4);
      uVar37 = UVar54 - uVar60;
      if ((piVar44 < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001745cf;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_00174238:
        puVar42 = (ulong *)((long)puVar42 + 1);
      }
    }
    else {
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar36;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar36 == *puVar38) {
          puVar45 = (ulong *)((long)puVar42 + 0xc);
          puVar36 = (ulong *)(piVar58 + 3);
          do {
            if (puVar1 <= puVar45) goto LAB_00174534;
            uVar35 = *puVar36;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar36 = puVar36 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_00174534:
        if ((puVar45 < puVar2) && ((int)*puVar36 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar36 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 4;
      uVar37 = (int)puVar42 - (int)piVar58;
      if ((iStart < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_001745cf;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
        goto LAB_00174238;
      }
    }
  }
  goto LAB_001745fc;
LAB_001745cf:
  puVar42 = (ulong *)((long)puVar38 + 1);
LAB_001745fc:
  if (uVar37 == 0) goto LAB_00175ac8;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00175a0e;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) goto LAB_00175a6b;
  if (iEnd < puVar42) goto LAB_00175a8a;
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar59 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_00175b06;
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar59 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar43 = pBVar59 + lVar39 + 0x20;
          *(undefined8 *)pBVar43 = *puVar5;
          *(undefined8 *)(pBVar43 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar43 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar43 + 0x20 < pBVar59 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = uVar37 + 3;
  if (pBVar53 < (BYTE *)0x3) goto LAB_00175a2d;
  pBVar59 = pBVar53 + -3;
  local_11c = local_144;
  local_144 = uVar37;
  if ((BYTE *)0xffff < pBVar59) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
LAB_0017474e:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00174774:
  psVar25->mlBase = (U16)pBVar59;
  seqStore->sequences = psVar25 + 1;
  puVar42 = (ulong *)((long)puVar42 + (long)pBVar53);
  src = puVar42;
  if (puVar42 <= puVar21) {
    uVar40 = UVar54 + 2;
    lVar39 = *(long *)(pBVar9 + uVar40);
    pUVar14[(ulong)(lVar39 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar40;
    pUVar14[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar42 + -2) - iVar50;
    pUVar15[(ulong)(lVar39 * -0x30e4432345000000) >> (bVar29 & 0x3f)] = uVar40;
    pUVar15[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e4432345000000) >> (bVar29 & 0x3f)] =
         ((int)puVar42 + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar40 = UVar30 - local_11c;
      pBVar59 = pBVar9;
      if (uVar40 < uVar17) {
        pBVar59 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar40 < 3) || (*(int *)(pBVar59 + uVar40) != (int)*puVar42)) {
        bVar16 = false;
        uVar40 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar40 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar59 + uVar40) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00175a0e;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_00175a6b;
        if (iEnd < src) goto LAB_00175a8a;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_00175a2d;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        uVar35 = *puVar42;
        pUVar15[uVar35 * -0x30e4432345000000 >> (bVar29 & 0x3f)] = UVar30;
        pUVar14[uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        puVar42 = (ulong *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        src = puVar42;
        uVar40 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar40;
    } while (bVar16);
  }
LAB_001749d9:
  if (puVar21 <= puVar42) goto LAB_001759df;
  goto LAB_00173bfa;
LAB_0017363b:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar42 + 1);
LAB_001732c2:
  if (iVar32 != 0xd) {
    if (iVar32 != 0) goto LAB_00173a38;
    puVar38 = (ulong *)((long)puVar42 + 4);
    puVar36 = (ulong *)(piVar58 + 1);
    if (uVar60 < uVar17) {
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)puVar38,(BYTE *)puVar36,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pBVar53 = (BYTE *)(sVar23 + 4);
      uVar37 = UVar54 - uVar60;
      if ((piVar44 < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_00173633;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_001732a4:
        puVar42 = (ulong *)((long)puVar42 + 1);
      }
    }
    else {
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar36;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar36 == *puVar38) {
          puVar45 = (ulong *)((long)puVar42 + 0xc);
          puVar36 = (ulong *)(piVar58 + 3);
          do {
            if (puVar1 <= puVar45) goto LAB_00173592;
            uVar35 = *puVar36;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar36 = puVar36 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_00173592:
        if ((puVar45 < puVar2) && ((int)*puVar36 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar36 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 4;
      uVar37 = (int)puVar42 - (int)piVar58;
      if ((iStart < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_00173633;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
        goto LAB_001732a4;
      }
    }
  }
  goto LAB_00173660;
LAB_00173633:
  puVar42 = (ulong *)((long)puVar38 + 1);
LAB_00173660:
  if (uVar37 == 0) goto LAB_00175ac8;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_00175a0e;
  if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) goto LAB_00175a6b;
  if (iEnd < puVar42) goto LAB_00175a8a;
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar59 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_00175b06;
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar59 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar43 = pBVar59 + lVar39 + 0x20;
          *(undefined8 *)pBVar43 = *puVar5;
          *(undefined8 *)(pBVar43 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar43 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar43 + 0x20 < pBVar59 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175ae7;
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = uVar37 + 3;
  if (pBVar53 < (BYTE *)0x3) goto LAB_00175a2d;
  pBVar59 = pBVar53 + -3;
  local_11c = local_144;
  local_144 = uVar37;
  if ((BYTE *)0xffff < pBVar59) {
    if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
LAB_001737b9:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_001737df:
  psVar25->mlBase = (U16)pBVar59;
  seqStore->sequences = psVar25 + 1;
  src = (void *)((long)puVar42 + (long)pBVar53);
  puVar42 = (ulong *)src;
  if (src <= puVar21) {
    uVar40 = UVar54 + 2;
    lVar39 = *(long *)(pBVar9 + uVar40);
    pUVar14[(ulong)(lVar39 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar40;
    pUVar14[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)src + -2) - iVar50;
    pUVar15[(ulong)(lVar39 * -0x30e4432340650000) >> (bVar29 & 0x3f)] = uVar40;
    pUVar15[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar29 & 0x3f)] =
         ((int)src + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar40 = UVar30 - local_11c;
      pBVar59 = pBVar9;
      if (uVar40 < uVar17) {
        pBVar59 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar40 < 3) || (*(int *)(pBVar59 + uVar40) != (int)*puVar42)) {
        bVar16 = false;
        uVar40 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar40 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar59 + uVar40) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00175a0e;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_00175a6b;
        if (iEnd < src) goto LAB_00175a8a;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_00175a2d;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        uVar35 = *puVar42;
        pUVar15[uVar35 * -0x30e4432340650000 >> (bVar29 & 0x3f)] = UVar30;
        pUVar14[uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        src = (void *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        puVar42 = (ulong *)src;
        uVar40 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar40;
    } while (bVar16);
  }
LAB_00173a38:
  if (puVar21 <= puVar42) goto LAB_001759df;
  goto LAB_00172c69;
LAB_001755a0:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar42 + 1);
  goto LAB_001752cd;
LAB_00175598:
  puVar42 = (ulong *)((long)puVar38 + 1);
  goto LAB_001755e3;
LAB_001726a6:
  iVar32 = 0xd;
  puVar42 = (ulong *)((long)puVar38 + 1);
LAB_00172325:
  if (iVar32 != 0xd) {
    if (iVar32 != 0) goto LAB_00172aa8;
    puVar38 = (ulong *)((long)puVar42 + 4);
    puVar36 = (ulong *)(piVar58 + 1);
    if (uVar60 < uVar17) {
      sVar23 = ZSTD_count_2segments
                         ((BYTE *)puVar38,(BYTE *)puVar36,(BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
      pBVar53 = (BYTE *)(sVar23 + 4);
      uVar37 = UVar54 - uVar60;
      if ((piVar44 < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_0017269e;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, piVar44 < piVar58));
LAB_00172307:
        puVar42 = (ulong *)((long)puVar42 + 1);
      }
    }
    else {
      puVar45 = puVar38;
      if (puVar38 < puVar1) {
        uVar46 = *puVar38 ^ *puVar36;
        uVar35 = 0;
        if (uVar46 != 0) {
          for (; (uVar46 >> uVar35 & 1) == 0; uVar35 = uVar35 + 1) {
          }
        }
        pBVar53 = (BYTE *)(uVar35 >> 3 & 0x1fffffff);
        if (*puVar36 == *puVar38) {
          puVar45 = (ulong *)((long)puVar42 + 0xc);
          puVar36 = (ulong *)(piVar58 + 3);
          do {
            if (puVar1 <= puVar45) goto LAB_00172603;
            uVar35 = *puVar36;
            uVar46 = *puVar45;
            uVar51 = uVar46 ^ uVar35;
            uVar49 = 0;
            if (uVar51 != 0) {
              for (; (uVar51 >> uVar49 & 1) == 0; uVar49 = uVar49 + 1) {
              }
            }
            pBVar53 = (BYTE *)((long)puVar45 + ((uVar49 >> 3 & 0x1fffffff) - (long)puVar38));
            puVar45 = puVar45 + 1;
            puVar36 = puVar36 + 1;
          } while (uVar35 == uVar46);
        }
      }
      else {
LAB_00172603:
        if ((puVar45 < puVar2) && ((int)*puVar36 == (int)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 4);
          puVar36 = (ulong *)((long)puVar36 + 4);
        }
        if ((puVar45 < puVar3) && ((short)*puVar36 == (short)*puVar45)) {
          puVar45 = (ulong *)((long)puVar45 + 2);
          puVar36 = (ulong *)((long)puVar36 + 2);
        }
        if (puVar45 < iEnd) {
          puVar45 = (ulong *)((long)puVar45 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar45));
        }
        pBVar53 = (BYTE *)((long)puVar45 - (long)puVar38);
      }
      pBVar53 = pBVar53 + 4;
      uVar37 = (int)puVar42 - (int)piVar58;
      if ((iStart < piVar58) && (src < puVar42)) {
        puVar38 = (ulong *)((long)puVar42 + -1);
        do {
          piVar58 = (int *)((long)piVar58 + -1);
          if ((BYTE)*puVar38 != *(BYTE *)piVar58) goto LAB_0017269e;
          pBVar53 = pBVar53 + 1;
          puVar42 = (ulong *)((long)puVar38 + -1);
        } while ((src < puVar38) && (puVar38 = puVar42, iStart < piVar58));
        goto LAB_00172307;
      }
    }
  }
LAB_001726cb:
  if (uVar37 == 0) {
LAB_00175ac8:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x6e9e,
                  "size_t ZSTD_compressBlock_doubleFast_dictMatchState_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_00175a0e:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468b,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_00175a4c:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar35 = (long)puVar42 - (long)src;
  puVar38 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar38 + uVar35)) {
LAB_00175a6b:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468e,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (iEnd < puVar42) {
LAB_00175a8a:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x468f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar22 < puVar42) {
    ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)puVar42,(BYTE *)puVar22);
  }
  else {
    uVar46 = *(ulong *)((long)src + 8);
    *puVar38 = *src;
    puVar38[1] = uVar46;
    if (0x10 < uVar35) {
      pBVar59 = seqStore->lit;
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar59 + 0x10) + (-0x10 - ((long)src + 0x10)))) {
LAB_00175b06:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x36a6,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar46 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar59 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar59 + 0x18) = uVar46;
      if (0x20 < (long)uVar35) {
        lVar39 = 0;
        do {
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x20);
          uVar18 = puVar5[1];
          pBVar43 = pBVar59 + lVar39 + 0x20;
          *(undefined8 *)pBVar43 = *puVar5;
          *(undefined8 *)(pBVar43 + 8) = uVar18;
          puVar5 = (undefined8 *)((long)src + lVar39 + 0x30);
          uVar18 = puVar5[1];
          *(undefined8 *)(pBVar43 + 0x10) = *puVar5;
          *(undefined8 *)(pBVar43 + 0x18) = uVar18;
          lVar39 = lVar39 + 0x20;
        } while (pBVar43 + 0x20 < pBVar59 + uVar35);
      }
    }
  }
  seqStore->lit = seqStore->lit + uVar35;
  if (0xffff < uVar35) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00175ae7:
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    seqStore->longLengthType = ZSTD_llt_literalLength;
    seqStore->longLengthPos =
         (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
  }
  psVar25 = seqStore->sequences;
  psVar25->litLength = (U16)uVar35;
  psVar25->offBase = uVar37 + 3;
  if (pBVar53 < (BYTE *)0x3) {
LAB_00175a2d:
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x46aa,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  pBVar59 = pBVar53 + -3;
  local_11c = local_144;
  local_144 = uVar37;
  if ((BYTE *)0xffff < pBVar59) {
    if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_00175aa9:
      __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46ad,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
LAB_0017281d:
    seqStore->longLengthType = ZSTD_llt_matchLength;
    seqStore->longLengthPos = (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
  }
LAB_00172843:
  psVar25->mlBase = (U16)pBVar59;
  seqStore->sequences = psVar25 + 1;
  puVar42 = (ulong *)((long)puVar42 + (long)pBVar53);
  src = puVar42;
  if (puVar42 <= puVar21) {
    uVar40 = UVar54 + 2;
    lVar39 = *(long *)(pBVar9 + uVar40);
    pUVar14[(ulong)(lVar39 * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] = uVar40;
    pUVar14[(ulong)(*(long *)((long)puVar42 + -2) * -0x30e44323485a9b9d) >> (bVar28 & 0x3f)] =
         ((int)puVar42 + -2) - iVar50;
    pUVar15[(ulong)(lVar39 * -0x30e44323405a9d00) >> (bVar29 & 0x3f)] = uVar40;
    pUVar15[(ulong)(*(long *)((long)puVar42 + -1) * -0x30e44323405a9d00) >> (bVar29 & 0x3f)] =
         ((int)puVar42 + -1) - iVar50;
    do {
      if (puVar21 < puVar42) break;
      UVar30 = (int)puVar42 - iVar50;
      uVar40 = UVar30 - local_11c;
      pBVar59 = pBVar9;
      if (uVar40 < uVar17) {
        pBVar59 = pBVar11 + -uVar56;
      }
      if (((uVar17 - 1) - uVar40 < 3) || (*(int *)(pBVar59 + uVar40) != (int)*puVar42)) {
        bVar16 = false;
        uVar40 = local_11c;
      }
      else {
        puVar38 = iEnd;
        if (uVar40 < uVar17) {
          puVar38 = mEnd;
        }
        sVar23 = ZSTD_count_2segments
                           ((BYTE *)((long)puVar42 + 4),(BYTE *)((long)(pBVar59 + uVar40) + 4),
                            (BYTE *)iEnd,(BYTE *)puVar38,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_00175a0e;
        if (0x20000 < seqStore->maxNbLit) goto LAB_00175a4c;
        puVar38 = (ulong *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < puVar38) goto LAB_00175a6b;
        if (iEnd < src) goto LAB_00175a8a;
        if (puVar22 < src) {
          ZSTD_safecopyLiterals((BYTE *)puVar38,(BYTE *)src,(BYTE *)src,(BYTE *)puVar22);
        }
        else {
          uVar35 = *(ulong *)((long)src + 8);
          *puVar38 = *src;
          puVar38[1] = uVar35;
        }
        psVar25 = seqStore->sequences;
        psVar25->litLength = 0;
        psVar25->offBase = 1;
        if (sVar23 + 4 < 3) goto LAB_00175a2d;
        if (0xffff < sVar23 + 1) {
          if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_00175aa9;
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar25 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar25->mlBase = (U16)(sVar23 + 1);
        seqStore->sequences = psVar25 + 1;
        uVar35 = *puVar42;
        pUVar15[uVar35 * -0x30e44323405a9d00 >> (bVar29 & 0x3f)] = UVar30;
        pUVar14[uVar35 * -0x30e44323485a9b9d >> (bVar28 & 0x3f)] = UVar30;
        puVar42 = (ulong *)(sVar23 + 4 + (long)puVar42);
        bVar16 = true;
        src = puVar42;
        uVar40 = local_144;
        local_144 = local_11c;
      }
      local_11c = uVar40;
    } while (bVar16);
  }
LAB_00172aa8:
  if (puVar21 <= puVar42) goto LAB_001759df;
  goto LAB_00171cc9;
LAB_0017269e:
  puVar42 = (ulong *)((long)puVar38 + 1);
  goto LAB_001726cb;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_dictMatchState_7(ms, seqStore, rep, src, srcSize);
    }
}